

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sx_str_block sx_findblock(char *str,char open,char close)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  sx_str_block sVar5;
  
  cVar3 = *str;
  if (cVar3 == '\0') {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar4 = str + 1;
    pcVar2 = (char *)0x0;
    do {
      pcVar1 = pcVar4;
      if (pcVar2 != (char *)0x0 || cVar3 != open) {
        if (pcVar2 == (char *)0x0) {
          pcVar1 = (char *)0x0;
        }
        else {
          pcVar1 = pcVar2;
          if (cVar3 == close) {
            pcVar4 = pcVar4 + -2;
            goto LAB_0010a61e;
          }
        }
      }
      pcVar2 = pcVar1;
      cVar3 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  pcVar4 = (char *)0x0;
LAB_0010a61e:
  sVar5.end = pcVar4;
  sVar5.start = pcVar2;
  return sVar5;
}

Assistant:

sx_str_block sx_findblock(const char* str, char open, char close)
{
    int count = 0;
    sx_str_block b = { NULL, NULL };

    for (char ch = *str; ch && count >= 0; ch = *++str) {
        if (!b.start && ch == open) {
            b.start = str + 1;
        } else if (b.start && ch == close) {
            b.end = str - 1;
            return b;
        }
    }

    return b;
}